

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O2

ssize_t __thiscall xs::TestMessage::write(TestMessage *this,int __fd,void *__buf,size_t __n)

{
  uint *puVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RAX;
  uint uVar2;
  undefined4 in_register_00000034;
  MessageWriter writer;
  MessageWriter local_18;
  
  local_18.m_buf = in_RAX;
  MessageWriter::MessageWriter
            (&local_18,(this->super_Message).type,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_register_00000034,__fd));
  MessageWriter::put<char_const*>(&local_18,(this->test)._M_dataplus._M_p);
  puVar1 = (uint *)((local_18.m_buf)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  uVar2 = *(int *)&((local_18.m_buf)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar1;
  *puVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000;
  return (ssize_t)puVar1;
}

Assistant:

void TestMessage::write (vector<deUint8>& buf) const
{
	MessageWriter writer(type, buf);
	writer.put(test.c_str());
}